

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int resize_properties(JSContext *ctx,JSShape **psh,JSObject *p,uint32_t count)

{
  JSShape *__src;
  list_head *plVar1;
  JSRuntime *pJVar2;
  uint uVar3;
  uint uVar4;
  JSProperty *pJVar5;
  void *pvVar6;
  uint *puVar7;
  uint uVar8;
  list_head *plVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  JSShape *__dest;
  uint uVar13;
  JSShape *old_sh;
  
  __src = *psh;
  uVar4 = (__src->prop_size * 3) / 2;
  if ((int)uVar4 < (int)count) {
    uVar4 = count;
  }
  uVar12 = (ulong)uVar4;
  if (p != (JSObject *)0x0) {
    pJVar5 = (JSProperty *)js_realloc(ctx,p->prop,uVar12 << 4);
    if (pJVar5 == (JSProperty *)0x0) {
      return -1;
    }
    p->prop = pJVar5;
  }
  uVar13 = __src->prop_hash_mask;
  uVar8 = uVar13 + 1;
  uVar3 = uVar8;
  do {
    uVar10 = uVar3;
    uVar11 = (ulong)uVar10;
    uVar3 = uVar10 * 2;
  } while (uVar10 < uVar4);
  if (uVar10 == uVar8) {
    plVar1 = (__src->header).link.prev;
    plVar9 = (__src->header).link.next;
    plVar1->next = plVar9;
    plVar9->prev = plVar1;
    (__src->header).link.prev = (list_head *)0x0;
    (__src->header).link.next = (list_head *)0x0;
    uVar11 = (ulong)uVar8;
    pvVar6 = js_realloc(ctx,&(__src->header).ref_count + ~(ulong)uVar13,
                        uVar11 * 4 + uVar12 * 8 + 0x40);
    if (pvVar6 == (void *)0x0) {
      plVar1 = &(__src->header).link;
      pJVar2 = ctx->rt;
      plVar9 = (pJVar2->gc_obj_list).prev;
      plVar9->next = plVar1;
      (__src->header).link.prev = plVar9;
      (__src->header).link.next = &pJVar2->gc_obj_list;
      (pJVar2->gc_obj_list).prev = plVar1;
      return -1;
    }
    __dest = (JSShape *)((long)pvVar6 + uVar11 * 4);
    plVar9 = (list_head *)((long)pvVar6 + uVar11 * 4 + 8);
    pJVar2 = ctx->rt;
    plVar1 = (pJVar2->gc_obj_list).prev;
    plVar1->next = plVar9;
    *(list_head **)((long)pvVar6 + uVar11 * 4 + 8) = plVar1;
    *(list_head **)((long)pvVar6 + uVar11 * 4 + 0x10) = &pJVar2->gc_obj_list;
    (pJVar2->gc_obj_list).prev = plVar9;
  }
  else {
    pvVar6 = js_malloc(ctx,uVar11 * 4 + uVar12 * 8 + 0x40);
    if (pvVar6 == (void *)0x0) {
      return -1;
    }
    __dest = (JSShape *)((long)pvVar6 + uVar11 * 4);
    plVar1 = (__src->header).link.prev;
    plVar9 = (__src->header).link.next;
    plVar1->next = plVar9;
    plVar9->prev = plVar1;
    (__src->header).link.prev = (list_head *)0x0;
    (__src->header).link.next = (list_head *)0x0;
    memcpy(__dest,__src,(long)__src->prop_count * 8 + 0x40);
    plVar9 = (list_head *)((long)pvVar6 + uVar11 * 4 + 8);
    pJVar2 = ctx->rt;
    plVar1 = (pJVar2->gc_obj_list).prev;
    plVar1->next = plVar9;
    *(list_head **)((long)pvVar6 + uVar11 * 4 + 8) = plVar1;
    *(list_head **)((long)pvVar6 + uVar11 * 4 + 0x10) = &pJVar2->gc_obj_list;
    (pJVar2->gc_obj_list).prev = plVar9;
    *(uint *)((long)pvVar6 + uVar11 * 4 + 0x20) = uVar10 - 1;
    memset(pvVar6,0,uVar11 * 4);
    puVar7 = (uint *)((long)pvVar6 + uVar11 * 4 + 0x40);
    for (uVar13 = 0; uVar13 < (uint)__dest->prop_count; uVar13 = uVar13 + 1) {
      if (puVar7[1] != 0) {
        uVar12 = ~(ulong)(puVar7[1] & uVar10 - 1);
        *puVar7 = *puVar7 & 0xfc000000 | (&(__dest->header).ref_count)[uVar12] & 0x3ffffffU;
        (&(__dest->header).ref_count)[uVar12] = uVar13 + 1;
      }
      puVar7 = puVar7 + 2;
    }
    (*(ctx->rt->mf).js_free)
              (&ctx->rt->malloc_state,&(__src->header).ref_count + ~(ulong)__src->prop_hash_mask);
  }
  *psh = __dest;
  __dest->prop_size = uVar4;
  return 0;
}

Assistant:

static no_inline int resize_properties(JSContext *ctx, JSShape **psh,
                                       JSObject *p, uint32_t count)
{
    JSShape *sh;
    uint32_t new_size, new_hash_size, new_hash_mask, i;
    JSShapeProperty *pr;
    void *sh_alloc;
    intptr_t h;

    sh = *psh;
    new_size = max_int(count, sh->prop_size * 3 / 2);
    /* Reallocate prop array first to avoid crash or size inconsistency
       in case of memory allocation failure */
    if (p) {
        JSProperty *new_prop;
        new_prop = js_realloc(ctx, p->prop, sizeof(new_prop[0]) * new_size);
        if (unlikely(!new_prop))
            return -1;
        p->prop = new_prop;
    }
    new_hash_size = sh->prop_hash_mask + 1;
    while (new_hash_size < new_size)
        new_hash_size = 2 * new_hash_size;
    if (new_hash_size != (sh->prop_hash_mask + 1)) {
        JSShape *old_sh;
        /* resize the hash table and the properties */
        old_sh = sh;
        sh_alloc = js_malloc(ctx, get_shape_size(new_hash_size, new_size));
        if (!sh_alloc)
            return -1;
        sh = get_shape_from_alloc(sh_alloc, new_hash_size);
        list_del(&old_sh->header.link);
        /* copy all the fields and the properties */
        memcpy(sh, old_sh,
               sizeof(JSShape) + sizeof(sh->prop[0]) * old_sh->prop_count);
        list_add_tail(&sh->header.link, &ctx->rt->gc_obj_list);
        new_hash_mask = new_hash_size - 1;
        sh->prop_hash_mask = new_hash_mask;
        memset(prop_hash_end(sh) - new_hash_size, 0,
               sizeof(prop_hash_end(sh)[0]) * new_hash_size);
        for(i = 0, pr = sh->prop; i < sh->prop_count; i++, pr++) {
            if (pr->atom != JS_ATOM_NULL) {
                h = ((uintptr_t)pr->atom & new_hash_mask);
                pr->hash_next = prop_hash_end(sh)[-h - 1];
                prop_hash_end(sh)[-h - 1] = i + 1;
            }
        }
        js_free(ctx, get_alloc_from_shape(old_sh));
    } else {
        /* only resize the properties */
        list_del(&sh->header.link);
        sh_alloc = js_realloc(ctx, get_alloc_from_shape(sh),
                              get_shape_size(new_hash_size, new_size));
        if (unlikely(!sh_alloc)) {
            /* insert again in the GC list */
            list_add_tail(&sh->header.link, &ctx->rt->gc_obj_list);
            return -1;
        }
        sh = get_shape_from_alloc(sh_alloc, new_hash_size);
        list_add_tail(&sh->header.link, &ctx->rt->gc_obj_list);
    }
    *psh = sh;
    sh->prop_size = new_size;
    return 0;
}